

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeCasts.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_168::EarlyCastFinder::flushRefCastResult
          (EarlyCastFinder *this,size_t index,Module *module)

{
  RefCast *pRVar1;
  reference __k;
  reference pvVar2;
  RefCast **ppRVar3;
  LocalGet *pLVar4;
  mapped_type *ppRVar5;
  Expression *fallthrough;
  RefCast **bestCast;
  LocalGet **target;
  Module *module_local;
  size_t index_local;
  EarlyCastFinder *this_local;
  
  __k = std::
        vector<wasm::(anonymous_namespace)::RefCastInfo,_std::allocator<wasm::(anonymous_namespace)::RefCastInfo>_>
        ::operator[](&this->currRefCastMove,index);
  if (__k->target != (LocalGet *)0x0) {
    pvVar2 = std::
             vector<wasm::(anonymous_namespace)::RefCastInfo,_std::allocator<wasm::(anonymous_namespace)::RefCastInfo>_>
             ::operator[](&this->currRefCastMove,index);
    ppRVar3 = &pvVar2->bestCast;
    if (*ppRVar3 != (RefCast *)0x0) {
      pLVar4 = (LocalGet *)
               Properties::getFallthrough((Expression *)*ppRVar3,&this->options,module,AllowTeeBrIf)
      ;
      if (pLVar4 != __k->target) {
        pRVar1 = *ppRVar3;
        ppRVar5 = std::
                  unordered_map<wasm::LocalGet_*,_wasm::RefCast_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::RefCast_*>_>_>
                  ::operator[](&this->refCastToApply,&__k->target);
        *ppRVar5 = pRVar1;
      }
      *ppRVar3 = (RefCast *)0x0;
    }
    __k->target = (LocalGet *)0x0;
  }
  return;
}

Assistant:

void flushRefCastResult(size_t index, Module& module) {
    auto& target = currRefCastMove[index].target;
    if (target) {
      auto& bestCast = currRefCastMove[index].bestCast;
      if (bestCast) {
        // If the fallthrough is equal to the target, this means the cast is
        // already at the target local.get and doesn't need to be duplicated
        // again.
        auto* fallthrough =
          Properties::getFallthrough(bestCast, options, module);
        if (fallthrough != target) {
          refCastToApply[target] = bestCast;
        }
        bestCast = nullptr;
      }
      target = nullptr;
    }
  }